

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

LogStream *
Assimp::LogStream::createDefaultStream(aiDefaultLogStream streams,char *name,IOSystem *io)

{
  FileLogStream *this;
  LogStream *pLVar1;
  _func_int **pp_Var2;
  
  switch(streams) {
  case aiDefaultLogStream_FILE:
    if (name == (char *)0x0) {
      return (LogStream *)0x0;
    }
    if (*name == '\0') {
      return (LogStream *)0x0;
    }
    this = (FileLogStream *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
    FileLogStream::FileLogStream(this,name,io);
    return &this->super_LogStream;
  case aiDefaultLogStream_STDOUT:
    pp_Var2 = (_func_int **)&std::cout;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/DefaultLogger.cpp"
                  ,0x77,
                  "static LogStream *Assimp::LogStream::createDefaultStream(aiDefaultLogStream, const char *, IOSystem *)"
                 );
  case aiDefaultLogStream_STDERR:
    pp_Var2 = (_func_int **)&std::cerr;
    break;
  case aiDefaultLogStream_DEBUGGER:
    return (LogStream *)0x0;
  }
  pLVar1 = (LogStream *)Intern::AllocateFromAssimpHeap::operator_new(0x10);
  pLVar1->_vptr_LogStream = (_func_int **)&PTR__LogStream_00758188;
  pLVar1[1]._vptr_LogStream = pp_Var2;
  return pLVar1;
}

Assistant:

LogStream* LogStream::createDefaultStream(aiDefaultLogStream    streams,
    const char* name /*= "AssimpLog.txt"*/,
    IOSystem* io            /*= NULL*/)
{
    switch (streams)
    {
        // This is a platform-specific feature
    case aiDefaultLogStream_DEBUGGER:
#ifdef WIN32
        return new Win32DebugLogStream();
#else
        return nullptr;
#endif

    // Platform-independent default streams
    case aiDefaultLogStream_STDERR:
        return new StdOStreamLogStream(std::cerr);
    case aiDefaultLogStream_STDOUT:
        return new StdOStreamLogStream(std::cout);
    case aiDefaultLogStream_FILE:
        return (name && *name ? new FileLogStream(name,io) : nullptr );
    default:
        // We don't know this default log stream, so raise an assertion
        ai_assert(false);

    };

    // For compilers without dead code path detection
    return nullptr;
}